

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

MaterialList * rw::MaterialList::streamRead(Stream *stream,MaterialList *matlist)

{
  bool bVar1;
  uint uVar2;
  Material **ppMVar3;
  void *data;
  long lVar4;
  Material *mat;
  ulong uVar5;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    matlist->materials = (Material **)0x0;
    matlist->numMaterials = 0;
    matlist->space = 0;
    uVar2 = Stream::readI32(stream);
    if (uVar2 == 0) {
      return matlist;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 778"
    ;
    ppMVar3 = (Material **)(*Engine::memfuncs)((long)(int)uVar2 << 3,0x30007);
    matlist->materials = ppMVar3;
    if (ppMVar3 != (Material **)0x0) {
      matlist->space = uVar2;
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 783"
      ;
      data = (void *)(*Engine::memfuncs)((long)(int)(uVar2 * 4),0x10007);
      Stream::read32(stream,data,uVar2 * 4);
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          lVar4 = (long)*(int *)((long)data + uVar5 * 4);
          if (lVar4 < 0) {
            bVar1 = findChunk(stream,7,(uint32 *)0x0,(uint32 *)0x0);
            if (!bVar1) {
              streamRead();
              goto LAB_0010b092;
            }
            mat = Material::streamRead(stream);
            if (mat == (Material *)0x0) goto LAB_0010b092;
          }
          else {
            mat = matlist->materials[lVar4];
            mat->refCount = mat->refCount + 1;
          }
          appendMaterial(matlist,mat);
          Material::destroy(mat);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      (*DAT_00149850)(data);
      return matlist;
    }
  }
  else {
    streamRead();
  }
  data = (void *)0x0;
LAB_0010b092:
  (*DAT_00149850)(data);
  deinit(matlist);
  return (MaterialList *)0x0;
}

Assistant:

MaterialList*
MaterialList::streamRead(Stream *stream, MaterialList *matlist)
{
	int32 *indices = nil;
	int32 numMat;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	matlist->init();
	numMat = stream->readI32();
	if(numMat == 0)
		return matlist;
	matlist->materials = rwMallocT(Material*,numMat, MEMDUR_EVENT | ID_MATERIAL);
	if(matlist->materials == nil)
		goto fail;
	matlist->space = numMat;

	indices = (int32*)rwMalloc(numMat*4, MEMDUR_FUNCTION | ID_MATERIAL);
	stream->read32(indices, numMat*4);

	Material *m;
	for(int32 i = 0; i < numMat; i++){
		if(indices[i] >= 0){
			m = matlist->materials[indices[i]];
			m->addRef();
		}else{
			if(!findChunk(stream, ID_MATERIAL, nil, nil)){
				RWERROR((ERR_CHUNK, "MATERIAL"));
				goto fail;
			}
			m = Material::streamRead(stream);
			if(m == nil)
				goto fail;
		}
		matlist->appendMaterial(m);
		m->destroy();
	}
	rwFree(indices);
	return matlist;
fail:
	rwFree(indices);
	matlist->deinit();
	return nil;
}